

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# findsaddr-udp.c
# Opt level: O0

char * findsaddr(sockaddr_in *to,in6_addr *from)

{
  int iVar1;
  uint32_t uVar2;
  socklen_t local_50;
  int local_4c;
  socklen_t len;
  int s;
  sockaddr_in cfrom;
  sockaddr_in cto;
  char *errstr;
  in6_addr *from_local;
  sockaddr_in *to_local;
  
  local_4c = socket(2,2,0);
  if (local_4c == -1) {
    to_local = (sockaddr_in *)anon_var_dwarf_2384;
  }
  else {
    cto.sin_zero[0] = '\0';
    cto.sin_zero[1] = '\0';
    cto.sin_zero[2] = '\0';
    cto.sin_zero[3] = '\0';
    cto.sin_zero[4] = '\0';
    cto.sin_zero[5] = '\0';
    cto.sin_zero[6] = '\0';
    cto.sin_zero[7] = '\0';
    local_50 = 0x10;
    memcpy(cfrom.sin_zero,to,0x10);
    cfrom.sin_zero._2_2_ = htons(0xffff);
    iVar1 = connect(local_4c,(sockaddr *)cfrom.sin_zero,local_50);
    if (iVar1 == -1) {
      cto.sin_zero = (uchar  [8])anon_var_dwarf_23a2;
    }
    else {
      iVar1 = getsockname(local_4c,(sockaddr *)&len,&local_50);
      if (iVar1 == -1) {
        cto.sin_zero = (uchar  [8])anon_var_dwarf_23b8;
      }
      else if ((local_50 == 0x10) && ((short)len == 2)) {
        (from->__in6_u).__u6_addr32[0] = 0;
        (from->__in6_u).__u6_addr32[1] = 0;
        uVar2 = htonl(0xffff);
        (from->__in6_u).__u6_addr32[2] = uVar2;
        (from->__in6_u).__u6_addr32[3] = s;
      }
      else {
        cto.sin_zero = (uchar  [8])anon_var_dwarf_23c2;
      }
    }
    close(local_4c);
    to_local = (sockaddr_in *)cto.sin_zero;
  }
  return (char *)to_local;
}

Assistant:

const char *findsaddr(register const struct sockaddr_in *to,
                      struct in6_addr *from) {
    const char *errstr;
    struct sockaddr_in cto, cfrom;
    SOCKET s;
    socklen_t len;

    s = socket(AF_INET, SOCK_DGRAM, 0);
    if (s == INVALID_SOCKET)
        return ("failed to open DGRAM socket for src addr selection.");
    errstr = NULL;
    len = sizeof(struct sockaddr_in);
    memcpy(&cto, to, len);
    cto.sin_port = htons(65535); /* Dummy port for connect(2). */
    if (connect(s, (struct sockaddr *)&cto, len) == -1) {
        errstr = "failed to connect to peer for src addr selection.";
        goto err;
    }

    if (getsockname(s, (struct sockaddr *)&cfrom, &len) == -1) {
        errstr = "failed to get socket name for src addr selection.";
        goto err;
    }

    if (len != sizeof(struct sockaddr_in) || cfrom.sin_family != AF_INET) {
        errstr = "unexpected address family in src addr selection.";
        goto err;
    }

    ((uint32_t *)from)[0] = 0;
    ((uint32_t *)from)[1] = 0;
    ((uint32_t *)from)[2] = htonl(0xffff);
    ((uint32_t *)from)[3] = cfrom.sin_addr.s_addr;

err:
    (void)CLOSE(s);

    /* No error (string) to return. */
    return (errstr);
}